

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTree::insertItem(QGraphicsSceneBspTree *this,QGraphicsItem *item,QRectF *rect)

{
  Type TVar1;
  Node *pNVar2;
  long in_FS_OFFSET;
  double dVar3;
  anon_class_8_1_898d2811 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.item = item;
  if ((this->nodes).d.size != 0) {
    pNVar2 = (this->nodes).d.ptr;
    TVar1 = pNVar2->type;
    if (TVar1 == Horizontal) {
      if (rect->yp <= (pNVar2->field_0).offset && (pNVar2->field_0).offset != rect->yp) {
        climbTree<QGraphicsSceneBspTree::insertItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,&local_28,rect,1);
        dVar3 = rect->yp + rect->h;
LAB_005b0853:
        if (dVar3 < (pNVar2->field_0).offset) goto LAB_005b086b;
      }
    }
    else {
      if (TVar1 != Vertical) {
        if (TVar1 == Leaf) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            QList<QGraphicsItem_*>::prepend((this->leaves).d.ptr + (pNVar2->field_0).leafIndex,item)
            ;
            return;
          }
          goto LAB_005b0885;
        }
        goto LAB_005b086b;
      }
      if (rect->xp <= (pNVar2->field_0).offset && (pNVar2->field_0).offset != rect->xp) {
        climbTree<QGraphicsSceneBspTree::insertItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,&local_28,rect,1);
        dVar3 = rect->xp + rect->w;
        goto LAB_005b0853;
      }
    }
    climbTree<QGraphicsSceneBspTree::insertItem(QGraphicsItem*,QRectF_const&)::__0&>
              (this,&local_28,rect,2);
  }
LAB_005b086b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_005b0885:
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::insertItem(QGraphicsItem *item, const QRectF &rect)
{
    climbTree([item](QList<QGraphicsItem *> *items){
        items->prepend(item);
    }, rect);
}